

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

Triple * __thiscall llvm::Triple::merge_abi_cxx11_(Triple *this,Triple *Other)

{
  bool bVar1;
  VendorType VVar2;
  string *psVar3;
  Triple *in_RDX;
  Triple *Other_local;
  Triple *this_local;
  
  VVar2 = getVendor(Other);
  if ((VVar2 == Apple) && (bVar1 = isOSVersionLT(in_RDX,Other), bVar1)) {
    psVar3 = str_abi_cxx11_(Other);
    std::__cxx11::string::string((string *)this,(string *)psVar3);
  }
  else {
    psVar3 = str_abi_cxx11_(in_RDX);
    std::__cxx11::string::string((string *)this,(string *)psVar3);
  }
  return this;
}

Assistant:

std::string Triple::merge(const Triple &Other) const {
  // If vendor is apple, pick the triple with the larger version number.
  if (getVendor() == Triple::Apple)
    if (Other.isOSVersionLT(*this))
      return str();

  return Other.str();
}